

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::colSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  uint *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int p_col;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  pointer pnVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  int *piVar17;
  long lVar18;
  int *piVar19;
  int *piVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  int *piVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar21 = (this->temp).stage;
  if (0 < iVar21) {
    piVar5 = (this->row).orig;
    piVar6 = (this->row).perm;
    piVar7 = (this->temp).s_mark;
    lVar26 = 0;
    piVar19 = (this->u).row.idx;
    do {
      iVar3 = piVar5[lVar26];
      lVar29 = (long)(this->u).row.len[iVar3];
      piVar20 = piVar19;
      if (0 < lVar29) {
        iVar21 = (this->u).row.start[iVar3];
        lVar31 = 0;
        do {
          p_col = piVar19[iVar21 + lVar31];
          piVar8 = (this->u).col.idx;
          piVar9 = (this->u).col.start;
          piVar10 = (this->u).col.len;
          piVar11 = (this->temp).s_cact;
          iVar27 = (piVar10[p_col] + piVar9[p_col]) - piVar11[p_col];
          piVar17 = piVar8 + iVar27;
          do {
            piVar28 = piVar17;
            piVar17 = piVar28 + 1;
          } while (*piVar28 != iVar3);
          *piVar28 = piVar8[iVar27];
          piVar8[iVar27] = iVar3;
          iVar27 = piVar11[p_col];
          piVar11[p_col] = iVar27 + -1;
          if (iVar27 == 2) {
            iVar27 = piVar10[p_col];
            piVar10[p_col] = iVar27 + -1;
            iVar27 = piVar8[(long)piVar9[p_col] + (long)iVar27 + -1];
            if (-1 < piVar6[iVar27]) goto LAB_0027caed;
            piVar8 = (this->u).row.len;
            iVar25 = piVar8[iVar27] + -1;
            iVar4 = (this->u).row.start[iVar27];
            piVar8[iVar27] = iVar25;
            lVar22 = (long)(iVar4 + iVar25);
            lVar23 = lVar22 * 4 + 4;
            lVar18 = lVar22 * 0x38 + 0x68;
            do {
              lVar30 = lVar18;
              lVar24 = lVar23 + -4;
              lVar16 = lVar23 + -4;
              lVar23 = lVar24;
              lVar18 = lVar30 + -0x38;
            } while (*(int *)((long)piVar20 + lVar16) != p_col);
            pnVar12 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_68.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(&pnVar12[-2].m_backend.data + 1) + lVar30);
            puVar1 = (uint *)((long)pnVar12[-2].m_backend.data._M_elems + lVar30 + 8);
            local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)pnVar12[-2].m_backend.data._M_elems + lVar30 + 0x18);
            local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_68.m_backend.exp = *(int *)((long)(&pnVar12[-2].m_backend.data + 1) + 8U + lVar30)
            ;
            local_68.m_backend.neg =
                 *(bool *)((long)(&pnVar12[-2].m_backend.data + 1) + 0xcU + lVar30);
            local_68.m_backend._48_8_ =
                 *(undefined8 *)((long)pnVar12[-1].m_backend.data._M_elems + lVar30);
            setPivot(this,(this->temp).stage,p_col,iVar27,&local_68);
            iVar27 = (this->temp).stage;
            (this->temp).stage = iVar27 + 1;
            piVar7[iVar27] = p_col;
            pnVar12 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)((long)(&pnVar12[-2].m_backend.data + 1) + lVar30) =
                 *(undefined8 *)((long)pnVar12[lVar22].m_backend.data._M_elems + 0x20);
            uVar13 = *(undefined8 *)pnVar12[lVar22].m_backend.data._M_elems;
            uVar14 = *(undefined8 *)((long)pnVar12[lVar22].m_backend.data._M_elems + 8);
            puVar1 = (uint *)((long)pnVar12[lVar22].m_backend.data._M_elems + 0x10);
            uVar15 = *(undefined8 *)(puVar1 + 2);
            puVar2 = (undefined8 *)((long)pnVar12[-2].m_backend.data._M_elems + lVar30 + 0x18);
            *puVar2 = *(undefined8 *)puVar1;
            puVar2[1] = uVar15;
            puVar2 = (undefined8 *)((long)pnVar12[-2].m_backend.data._M_elems + lVar30 + 8);
            *puVar2 = uVar13;
            puVar2[1] = uVar14;
            *(int *)((long)(&pnVar12[-2].m_backend.data + 1) + 8U + lVar30) =
                 pnVar12[lVar22].m_backend.exp;
            *(bool *)((long)(&pnVar12[-2].m_backend.data + 1) + 0xcU + lVar30) =
                 pnVar12[lVar22].m_backend.neg;
            *(undefined8 *)((long)pnVar12[-1].m_backend.data._M_elems + lVar30) =
                 *(undefined8 *)&pnVar12[lVar22].m_backend.fpclass;
            piVar20 = (this->u).row.idx;
            *(int *)((long)piVar20 + lVar24) = piVar20[lVar22];
          }
          else if (iVar27 == 1) {
LAB_0027caed:
            this->stat = SINGULAR;
            return;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != lVar29);
        iVar21 = (this->temp).stage;
      }
      lVar26 = lVar26 + 1;
      piVar19 = piVar20;
    } while (lVar26 < iVar21);
  }
  return;
}

Assistant:

void CLUFactor<R>::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}